

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

connectdata * Curl_cpool_get_conn(Curl_easy *data,curl_off_t conn_id)

{
  curl_off_t local_38;
  cpool_find_ctx fctx;
  cpool *cpool;
  curl_off_t conn_id_local;
  Curl_easy *data_local;
  
  fctx.conn = (connectdata *)cpool_get_instance(data);
  if (fctx.conn == (connectdata *)0x0) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    fctx.id = 0;
    local_38 = conn_id;
    if (fctx.conn != (connectdata *)0x0) {
      if (((Curl_share *)((fctx.conn)->meta_hash).table != (Curl_share *)0x0) &&
         ((((Curl_share *)((fctx.conn)->meta_hash).table)->specifier & 0x20) != 0)) {
        Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
      }
      *(byte *)&((fctx.conn)->meta_hash).hash_func =
           *(byte *)&((fctx.conn)->meta_hash).hash_func & 0xfe | 1;
    }
    cpool_foreach(data,(cpool *)fctx.conn,&local_38,cpool_find_conn);
    if (((fctx.conn != (connectdata *)0x0) &&
        (*(byte *)&((fctx.conn)->meta_hash).hash_func =
              *(byte *)&((fctx.conn)->meta_hash).hash_func & 0xfe,
        ((fctx.conn)->meta_hash).table != (Curl_hash_element **)0x0)) &&
       (((ulong)*((fctx.conn)->meta_hash).table & 0x2000000000) != 0)) {
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
    }
    data_local = (Curl_easy *)fctx.id;
  }
  return (connectdata *)data_local;
}

Assistant:

struct connectdata *Curl_cpool_get_conn(struct Curl_easy *data,
                                        curl_off_t conn_id)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_find_ctx fctx;

  if(!cpool)
    return NULL;
  fctx.id = conn_id;
  fctx.conn = NULL;
  CPOOL_LOCK(cpool, data);
  cpool_foreach(data, cpool, &fctx, cpool_find_conn);
  CPOOL_UNLOCK(cpool, data);
  return fctx.conn;
}